

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::OnBrTableExpr(Validator *this,BrTableExpr *expr)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  int __c;
  int __c_00;
  __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_> *__rhs;
  Var *var;
  iterator __end2;
  iterator __begin2;
  VarVector *__range2;
  BrTableExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)10>).super_Expr.loc;
  TypeChecker::BeginBrTable(&this->typechecker_);
  __end2 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(&expr->targets);
  var = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(&expr->targets);
  while( true ) {
    __rhs = (__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_> *)
            &var;
    bVar1 = __gnu_cxx::operator!=(&__end2,__rhs);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
              operator*(&__end2);
    pcVar2 = Var::index(this_00,(char *)__rhs,__c_00);
    TypeChecker::OnBrTableTarget(&this->typechecker_,(Index)pcVar2);
    __gnu_cxx::__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
    operator++(&__end2);
  }
  pcVar2 = Var::index(&expr->default_target,(char *)__rhs,__c);
  TypeChecker::OnBrTableTarget(&this->typechecker_,(Index)pcVar2);
  TypeChecker::EndBrTable(&this->typechecker_);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnBrTableExpr(BrTableExpr* expr) {
  expr_loc_ = &expr->loc;
  typechecker_.BeginBrTable();
  for (const Var& var : expr->targets) {
    typechecker_.OnBrTableTarget(var.index());
  }
  typechecker_.OnBrTableTarget(expr->default_target.index());
  typechecker_.EndBrTable();
  return Result::Ok;
}